

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

string * local_to_utf8(string *__return_storage_ptr__,string *str)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string local_to_utf8(const std::string& str)
{
    std::string out;
    local_to_utf8(str, &out);
    return out;
}